

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tts.cpp
# Opt level: O2

void fold(vector<float,_std::allocator<float>_> *data,int64_t n_out,int64_t n_win,int64_t n_hop,
         int64_t n_pad,vector<float,_std::allocator<float>_> *output)

{
  pointer pfVar1;
  pointer pfVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  value_type_conflict5 local_1c;
  
  local_1c = 0.0;
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)n_win,n_out,&local_1c);
  lVar4 = 0;
  lVar5 = 0;
  if (0 < n_out) {
    lVar5 = n_out;
  }
  lVar6 = 0;
  for (; lVar4 != lVar5; lVar4 = lVar4 + 1) {
    pfVar1 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar2 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    lVar3 = *(long *)n_win;
    for (lVar7 = lVar4 * 0x140 + -0x1e0; lVar7 < lVar4 * 0x140 + 800; lVar7 = lVar7 + 1) {
      if (((-1 < lVar7) && (lVar7 < n_out)) && (lVar6 < (long)pfVar2 - (long)pfVar1 >> 2)) {
        *(float *)(lVar3 + lVar7 * 4) = pfVar1[lVar6] + *(float *)(lVar3 + lVar7 * 4);
      }
      lVar6 = lVar6 + 1;
    }
  }
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)n_win,n_out - 0x3c0);
  return;
}

Assistant:

static void fold(const std::vector<float> & data, int64_t n_out, int64_t n_win, int64_t n_hop, int64_t n_pad, std::vector<float> & output) {
    int64_t output_height = n_out;
    int64_t kernel_w = n_win;
    int64_t stride_w = n_hop;
    int64_t width    = n_out;

    output.resize(width, 0.0f);

    int64_t col_idx = 0;
    for (int64_t w_col = 0; w_col < width; ++w_col) {
        int64_t start = w_col * stride_w - n_pad;
        int64_t end   = start + kernel_w;

        for (int64_t w_im = start; w_im < end; ++w_im) {
            if (w_im >= 0 && w_im < output_height && col_idx < (int64_t) data.size()) {
                output[w_im] += data[col_idx];
            }
            col_idx++;
        }
    }

    output.resize(n_out - 2 * n_pad);
}